

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

void vkt::SpirVAssembly::createTestsForAllStages
               (string *name,RGBA (*inputColors) [4],RGBA (*outputColors) [4],
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *testCodeFragments,vector<int,_std::allocator<int>_> *specConstants,
               TestCaseGroup *tests,qpTestResult failResult,string *failMessageTemplate)

{
  undefined8 uVar1;
  mapped_type *pmVar2;
  undefined4 in_stack_fffffffffffff1cc;
  qpTestResult failResult_00;
  string *in_stack_fffffffffffff1d8;
  ShaderElement *local_da0;
  ShaderElement *local_d88;
  ShaderElement *local_d70;
  InstanceContext local_be0;
  allocator<char> local_af9;
  string local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  key_type local_ab4;
  InstanceContext local_ab0;
  allocator<char> local_9c9;
  string local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  key_type local_984;
  InstanceContext local_980;
  allocator<char> local_899;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  key_type local_854;
  InstanceContext local_850;
  allocator<char> local_769;
  string local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  key_type local_724;
  InstanceContext local_720;
  allocator<char> local_639;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  key_type local_5f4;
  undefined1 local_5f0 [8];
  StageToSpecConstantMap specConstantMap;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  VkShaderStageFlagBits *local_4d0;
  undefined1 local_4c8 [8];
  ShaderElement geomPipelineStages [3];
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  VkShaderStageFlagBits *local_2b0;
  undefined1 local_2a8 [8];
  ShaderElement tessPipelineStages [4];
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_f1;
  string local_f0;
  VkShaderStageFlagBits *local_d0;
  undefined1 local_c8 [8];
  ShaderElement vertFragPipelineStages [2];
  TestCaseGroup *tests_local;
  vector<int,_std::allocator<int>_> *specConstants_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments_local;
  RGBA (*outputColors_local) [4];
  RGBA (*inputColors_local) [4];
  string *name_local;
  
  local_d0 = (VkShaderStageFlagBits *)local_c8;
  vertFragPipelineStages[1]._64_8_ = tests;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"vert",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"main",&local_129);
  ShaderElement::ShaderElement
            ((ShaderElement *)local_c8,&local_f0,&local_128,VK_SHADER_STAGE_VERTEX_BIT);
  local_d0 = &vertFragPipelineStages[0].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"frag",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"main",&local_179);
  ShaderElement::ShaderElement
            ((ShaderElement *)&vertFragPipelineStages[0].stage,&local_150,&local_178,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  geomPipelineStages[2]._70_1_ = 1;
  local_2b0 = (VkShaderStageFlagBits *)local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"vert",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"main",&local_2f9);
  ShaderElement::ShaderElement
            ((ShaderElement *)local_2a8,&local_2d0,&local_2f8,VK_SHADER_STAGE_VERTEX_BIT);
  local_2b0 = &tessPipelineStages[0].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"tessc",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"main",&local_349);
  ShaderElement::ShaderElement
            ((ShaderElement *)&tessPipelineStages[0].stage,&local_320,&local_348,
             VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_2b0 = &tessPipelineStages[1].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"tesse",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"main",&local_399);
  ShaderElement::ShaderElement
            ((ShaderElement *)&tessPipelineStages[1].stage,&local_370,&local_398,
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  local_2b0 = &tessPipelineStages[2].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"frag",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"main",(allocator<char> *)&geomPipelineStages[2].field_0x47);
  ShaderElement::ShaderElement
            ((ShaderElement *)&tessPipelineStages[2].stage,&local_3c0,&local_3e8,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  geomPipelineStages[2]._70_1_ = 0;
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&geomPipelineStages[2].field_0x47);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
  local_4d0 = (VkShaderStageFlagBits *)local_4c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"vert",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"main",&local_519);
  ShaderElement::ShaderElement
            ((ShaderElement *)local_4c8,&local_4f0,&local_518,VK_SHADER_STAGE_VERTEX_BIT);
  local_4d0 = &geomPipelineStages[0].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"geom",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"main",&local_569);
  ShaderElement::ShaderElement
            ((ShaderElement *)&geomPipelineStages[0].stage,&local_540,&local_568,
             VK_SHADER_STAGE_GEOMETRY_BIT);
  local_4d0 = &geomPipelineStages[1].stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"frag",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"main",
             (allocator<char> *)
             ((long)&specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ShaderElement::ShaderElement
            ((ShaderElement *)&geomPipelineStages[1].stage,&local_590,&local_5b8,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)local_5f0);
  local_5f4 = VK_SHADER_STAGE_VERTEX_BIT;
  pmVar2 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_5f0,&local_5f4);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar2,specConstants);
  uVar1 = vertFragPipelineStages[1]._64_8_;
  std::operator+(&local_618,name,"_vert");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"",&local_639);
  failResult_00 = (qpTestResult)failMessageTemplate;
  createInstanceContext<2ul>
            (&local_720,(SpirVAssembly *)local_c8,(ShaderElement (*) [2])inputColors,outputColors,
             (RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5f0,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffff1cc,failResult),
             failResult_00,in_stack_fffffffffffff1d8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            ((TestCaseGroup *)uVar1,&local_618,&local_638,addShaderCodeCustomVertex,
             runAndVerifyDefaultPipeline,&local_720);
  InstanceContext::~InstanceContext(&local_720);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_618);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_5f0);
  local_724 = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  pmVar2 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_5f0,&local_724);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar2,specConstants);
  uVar1 = vertFragPipelineStages[1]._64_8_;
  std::operator+(&local_748,name,"_tessc");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_769);
  createInstanceContext<4ul>
            (&local_850,(SpirVAssembly *)local_2a8,(ShaderElement (*) [4])inputColors,outputColors,
             (RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5f0,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffff1cc,failResult),
             failResult_00,in_stack_fffffffffffff1d8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            ((TestCaseGroup *)uVar1,&local_748,&local_768,addShaderCodeCustomTessControl,
             runAndVerifyDefaultPipeline,&local_850);
  InstanceContext::~InstanceContext(&local_850);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_748);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_5f0);
  local_854 = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
  pmVar2 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_5f0,&local_854);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar2,specConstants);
  uVar1 = vertFragPipelineStages[1]._64_8_;
  std::operator+(&local_878,name,"_tesse");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"",&local_899);
  createInstanceContext<4ul>
            (&local_980,(SpirVAssembly *)local_2a8,(ShaderElement (*) [4])inputColors,outputColors,
             (RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5f0,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffff1cc,failResult),
             failResult_00,in_stack_fffffffffffff1d8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            ((TestCaseGroup *)uVar1,&local_878,&local_898,addShaderCodeCustomTessEval,
             runAndVerifyDefaultPipeline,&local_980);
  InstanceContext::~InstanceContext(&local_980);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string((string *)&local_878);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_5f0);
  local_984 = VK_SHADER_STAGE_GEOMETRY_BIT;
  pmVar2 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_5f0,&local_984);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar2,specConstants);
  uVar1 = vertFragPipelineStages[1]._64_8_;
  std::operator+(&local_9a8,name,"_geom");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"",&local_9c9);
  createInstanceContext<3ul>
            (&local_ab0,(SpirVAssembly *)local_4c8,(ShaderElement (*) [3])inputColors,outputColors,
             (RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5f0,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffff1cc,failResult),
             failResult_00,in_stack_fffffffffffff1d8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            ((TestCaseGroup *)uVar1,&local_9a8,&local_9c8,addShaderCodeCustomGeometry,
             runAndVerifyDefaultPipeline,&local_ab0);
  InstanceContext::~InstanceContext(&local_ab0);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_5f0);
  local_ab4 = VK_SHADER_STAGE_FRAGMENT_BIT;
  pmVar2 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_5f0,&local_ab4);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar2,specConstants);
  uVar1 = vertFragPipelineStages[1]._64_8_;
  std::operator+(&local_ad8,name,"_frag");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"",&local_af9);
  createInstanceContext<2ul>
            (&local_be0,(SpirVAssembly *)local_c8,(ShaderElement (*) [2])inputColors,outputColors,
             (RGBA (*) [4])testCodeFragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5f0,(StageToSpecConstantMap *)CONCAT44(in_stack_fffffffffffff1cc,failResult),
             failResult_00,in_stack_fffffffffffff1d8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            ((TestCaseGroup *)uVar1,&local_ad8,&local_af8,addShaderCodeCustomFragment,
             runAndVerifyDefaultPipeline,&local_be0);
  InstanceContext::~InstanceContext(&local_be0);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)local_5f0);
  local_d70 = (ShaderElement *)&geomPipelineStages[2].stage;
  do {
    local_d70 = local_d70 + -1;
    ShaderElement::~ShaderElement(local_d70);
  } while (local_d70 != (ShaderElement *)local_4c8);
  local_d88 = (ShaderElement *)&tessPipelineStages[3].stage;
  do {
    local_d88 = local_d88 + -1;
    ShaderElement::~ShaderElement(local_d88);
  } while (local_d88 != (ShaderElement *)local_2a8);
  local_da0 = (ShaderElement *)&vertFragPipelineStages[1].stage;
  do {
    local_da0 = local_da0 + -1;
    ShaderElement::~ShaderElement(local_da0);
  } while (local_da0 != (ShaderElement *)local_c8);
  return;
}

Assistant:

void createTestsForAllStages (const std::string&			name,
							  const RGBA					(&inputColors)[4],
							  const RGBA					(&outputColors)[4],
							  const map<string, string>&	testCodeFragments,
							  const vector<deInt32>&		specConstants,
							  tcu::TestCaseGroup*			tests,
							  const qpTestResult			failResult,
							  const string&					failMessageTemplate)
{
	const ShaderElement		vertFragPipelineStages[]		=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		tessPipelineStages[]			=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("tessc", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("tesse", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		geomPipelineStages[]				=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("geom", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	StageToSpecConstantMap	specConstantMap;

	specConstantMap[VK_SHADER_STAGE_VERTEX_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_vert", "", addShaderCodeCustomVertex, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tessc", "", addShaderCodeCustomTessControl, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tesse", "", addShaderCodeCustomTessEval, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_GEOMETRY_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_geom", "", addShaderCodeCustomGeometry, runAndVerifyDefaultPipeline,
												 createInstanceContext(geomPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_FRAGMENT_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_frag", "", addShaderCodeCustomFragment, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));
}